

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxpmhandler.cpp
# Opt level: O0

QString * fbname(QString *fileName)

{
  bool bVar1;
  longlong *plVar2;
  qsizetype qVar3;
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  int start;
  int i;
  QString *s;
  anon_class_1_0_00000001 checkChar;
  undefined4 in_stack_ffffffffffffff58;
  CaseSensitivity in_stack_ffffffffffffff5c;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff60;
  QByteArrayView *this;
  int local_84;
  int local_80;
  storage_type *local_68;
  undefined1 local_58 [24];
  undefined1 local_40 [29];
  undefined1 local_23;
  QChar local_22;
  qsizetype local_20;
  QChar local_12;
  qsizetype local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ((DataPointer *)&in_RDI->m_size)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->m_data = &DAT_aaaaaaaaaaaaaaaa;
  in_RDI[1].m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QString::QString((QString *)in_stack_ffffffffffffff60,
                   (QString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  bVar1 = QString::isEmpty((QString *)0x337e98);
  if (!bVar1) {
    QChar::QChar<char16_t,_true>(&local_12,L'/');
    local_10 = QString::lastIndexOf
                         ((QString *)in_stack_ffffffffffffff60,
                          (QChar)(char16_t)((ulong)in_RDI >> 0x30),in_stack_ffffffffffffff5c);
    QChar::QChar<char16_t,_true>(&local_22,L'\\');
    local_20 = QString::lastIndexOf
                         ((QString *)in_stack_ffffffffffffff60,
                          (QChar)(char16_t)((ulong)in_RDI >> 0x30),in_stack_ffffffffffffff5c);
    plVar2 = qMax<long_long>(&local_10,&local_20);
    local_80 = (int)*plVar2;
    if (local_80 < 0) {
      local_80 = 0;
    }
    local_23 = 0xaa;
    local_84 = -1;
    while( true ) {
      in_stack_ffffffffffffff60 = (anon_class_1_0_00000001 *)(long)local_80;
      qVar3 = QString::size((QString *)this);
      if (qVar3 <= (long)in_stack_ffffffffffffff60) break;
      QString::at((QString *)in_RDI,(qsizetype)in_stack_ffffffffffffff60);
      bVar1 = fbname::anon_class_1_0_00000001::operator()
                        (in_stack_ffffffffffffff60,(QChar)(char16_t)((ulong)in_RDI >> 0x30));
      if (bVar1) {
        local_84 = local_80;
      }
      else if (0 < local_84) break;
      local_80 = local_80 + 1;
    }
    if (local_84 < 0) {
      QString::clear((QString *)in_stack_ffffffffffffff60);
    }
    else {
      QString::mid((longlong)local_40,(longlong)this);
      QString::operator=((QString *)in_stack_ffffffffffffff60,
                         (QString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      QString::~QString((QString *)0x337ffe);
    }
  }
  bVar1 = QString::isEmpty((QString *)0x33800a);
  if (bVar1) {
    QByteArrayView::QByteArrayView<6ul>(this,(char (*) [6])in_RDI);
    QVar4.m_data = local_68;
    QVar4.m_size = (qsizetype)local_58;
    QString::fromLatin1(QVar4);
    QString::operator=((QString *)in_stack_ffffffffffffff60,
                       (QString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    QString::~QString((QString *)0x33804e);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QString fbname(const QString &fileName) // get file basename (sort of)
{
    QString s = fileName;
    if (!s.isEmpty()) {
        int i = qMax(s.lastIndexOf(u'/'), s.lastIndexOf(u'\\'));
        if (i < 0)
            i = 0;
        auto checkChar = [](QChar ch) -> bool {
            uchar uc = ch.unicode();
            return isAsciiLetterOrNumber(uc) || uc == '_';
        };
        int start = -1;
        for (; i < s.size(); ++i) {
            if (checkChar(s.at(i))) {
                start = i;
            } else if (start > 0)
                break;
        }
        if (start < 0)
            s.clear();
        else
            s = s.mid(start, i - start);
    }
    if (s.isEmpty())
        s = QString::fromLatin1("dummy");
    return s;
}